

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uintserialize.h
# Opt level: O0

ssize_t bsplib::UIntSerialize<unsigned_long>::write(int __fd,void *__buf,size_t __n)

{
  byte bVar1;
  uint uVar2;
  undefined4 in_register_0000003c;
  undefined4 local_1c;
  uchar c;
  uchar m;
  int i;
  Buffer *bytes_local;
  unsigned_long x_local;
  
  bytes_local = (Buffer *)CONCAT44(in_register_0000003c,__fd);
  local_1c = 0;
  do {
    bVar1 = (byte)bytes_local;
    bytes_local = (Buffer *)((ulong)bytes_local >> 7);
    uVar2 = local_1c + 1;
    *(byte *)((long)__buf + (long)(int)local_1c) =
         bVar1 & 0x7f | (bytes_local != (Buffer *)0x0) * -0x80;
    local_1c = uVar2;
  } while (bytes_local != (Buffer *)0x0);
  return (ulong)uVar2;
}

Assistant:

static int write( UInt x, Buffer & bytes ) {
        assert( x >= 0 );
        int i = 0;
        do {
            unsigned char m = (1 << (CHAR_BIT-1));
            unsigned char c = x & (m-1); // cut out least significant bits
            x >>= (CHAR_BIT-1);          // and save these in c
            c |= (x > 0) * m ;  // set highest signif. bit if continuing
            bytes[i++] = c;
        } while ( x != 0 );
        return i;
    }